

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O1

void __thiscall
GeneratorProfile_generalSettings_Test::~GeneratorProfile_generalSettings_Test
          (GeneratorProfile_generalSettings_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratorProfile, generalSettings)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    const libcellml::GeneratorProfile::Profile profile = libcellml::GeneratorProfile::Profile::PYTHON;
    const bool falseValue = false;

    generatorProfile->setProfile(profile);

    generatorProfile->setHasInterface(falseValue);

    EXPECT_EQ(profile, generatorProfile->profile());
    EXPECT_EQ("python", libcellml::GeneratorProfile::profileAsString(generatorProfile->profile()));

    EXPECT_EQ(falseValue, generatorProfile->hasInterface());
}